

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O1

iterator __thiscall
QHash<QPagedPaintDevice::PdfVersion,QPdfEngine::PdfVersion>::emplace<QPdfEngine::PdfVersion_const&>
          (QHash<QPagedPaintDevice::PdfVersion,QPdfEngine::PdfVersion> *this,PdfVersion *key,
          PdfVersion *args)

{
  Data *pDVar1;
  Data<QHashPrivate::Node<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>_> *pDVar2;
  long in_FS_OFFSET;
  piter pVar3;
  QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion> local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar1 = *(Data **)this;
  if (pDVar1 != (Data *)0x0) {
    if ((uint)(pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i < 2) {
      if (pDVar1->size < pDVar1->numBuckets >> 1) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          pVar3 = (piter)emplace_helper<QPdfEngine::PdfVersion_const&>(this,key,args);
          return (iterator)pVar3;
        }
      }
      else {
        local_28.d._0_4_ = *args;
        pVar3 = (piter)QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>::
                       emplace_helper<QPdfEngine::PdfVersion>
                                 ((QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion> *)
                                  this,key,(PdfVersion *)&local_28);
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          return (iterator)pVar3;
        }
      }
      goto LAB_00135448;
    }
    if ((pDVar1 != (Data *)0x0) &&
       ((pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i != -1)) {
      LOCK();
      (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i =
           (pDVar1->ref).atomic._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
  }
  pDVar2 = *(Data<QHashPrivate::Node<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>_> **)
            this;
  local_28.d = pDVar1;
  if ((pDVar2 == (Data<QHashPrivate::Node<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>_> *
                 )0x0) || (1 < (uint)(pDVar2->ref).atomic._q_value.super___atomic_base<int>._M_i)) {
    pDVar2 = QHashPrivate::
             Data<QHashPrivate::Node<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>_>::
             detached(pDVar2);
    *(Data<QHashPrivate::Node<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>_> **)this =
         pDVar2;
  }
  pVar3 = (piter)emplace_helper<QPdfEngine::PdfVersion_const&>(this,key,args);
  QHash<QPagedPaintDevice::PdfVersion,_QPdfEngine::PdfVersion>::~QHash(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (iterator)pVar3;
  }
LAB_00135448:
  __stack_chk_fail();
}

Assistant:

iterator emplace(Key &&key, Args &&... args)
    {
        if (isDetached()) {
            if (d->shouldGrow()) // Construct the value now so that no dangling references are used
                return emplace_helper(std::move(key), T(std::forward<Args>(args)...));
            return emplace_helper(std::move(key), std::forward<Args>(args)...);
        }
        // else: we must detach
        const auto copy = *this; // keep 'args' alive across the detach/growth
        detach();
        return emplace_helper(std::move(key), std::forward<Args>(args)...);
    }